

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Client * __thiscall
capnp::Orphan<capnp::DynamicCapability>::getReader
          (Client *__return_storage_ptr__,Orphan<capnp::DynamicCapability> *this)

{
  RawBrandedSchema *pRVar1;
  Own<capnp::ClientHook,_std::nullptr_t> local_28;
  
  pRVar1 = (this->schema).super_Schema.raw;
  capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_28);
  (__return_storage_ptr__->super_Client).hook.disposer = local_28.disposer;
  (__return_storage_ptr__->super_Client).hook.ptr = local_28.ptr;
  local_28.ptr = (ClientHook *)0x0;
  (__return_storage_ptr__->schema).super_Schema.raw = pRVar1;
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_28);
  return __return_storage_ptr__;
}

Assistant:

DynamicCapability::Client Orphan<DynamicCapability>::getReader() const {
  return DynamicCapability::Client(schema, builder.asCapability());
}